

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,2,2,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  size_type sVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  comm *pcVar8;
  _Elt_pointer ppVar9;
  _Elt_pointer ppVar10;
  comm *comm_00;
  unsigned_long uVar11;
  pair<unsigned_long,_unsigned_long> *ppVar12;
  pair<unsigned_long,_unsigned_long> *ppVar13;
  _Elt_pointer ppVar14;
  pair<unsigned_long,_unsigned_long> *ppVar15;
  pair<unsigned_long,_unsigned_long> *ppVar16;
  long *plVar17;
  _Elt_pointer ppVar18;
  _Map_pointer pppVar19;
  pair<unsigned_long,_unsigned_long> *ppVar20;
  _Map_pointer pppVar21;
  _Map_pointer pppVar22;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar23;
  pair<unsigned_long,_unsigned_long> *ppVar24;
  ulong uVar25;
  _Map_pointer pppVar26;
  unsigned_long uVar27;
  pair<unsigned_long,_unsigned_long> *ppVar28;
  ulong uVar29;
  unsigned_long uVar30;
  unsigned_long uVar31;
  ulong uVar32;
  long lVar33;
  ulong *puVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  int iVar38;
  long lVar39;
  pointer puVar40;
  bool bVar41;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  unsigned_long local_min;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_208;
  comm *local_1b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1b0;
  pair<unsigned_long,_unsigned_long> *local_1a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1a0;
  pair<unsigned_long,_unsigned_long> *local_198;
  pair<unsigned_long,_unsigned_long> *ppStack_190;
  pair<unsigned_long,_unsigned_long> *local_188;
  pair<unsigned_long,_unsigned_long> *ppStack_180;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  _Map_pointer local_150;
  pair<unsigned_long,_unsigned_long> local_148;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_138;
  pair<unsigned_long,_unsigned_long> *local_120;
  unsigned_long local_118;
  pair<unsigned_long,_unsigned_long> *local_110;
  size_t local_108;
  size_type local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  _Map_pointer local_98;
  pair<unsigned_long,_unsigned_long> *local_90;
  long local_88;
  long local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_208._M_impl.super__Deque_impl_data._M_finish._M_last =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_first =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_start._M_last =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_208._M_impl.super__Deque_impl_data._M_start._M_cur =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_start._M_first =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_208._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_208._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1b0 = right_nsv;
  local_188 = (pair<unsigned_long,_unsigned_long> *)left_nsv;
  local_170 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_108 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_208,0);
  local_100 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_1b8 = comm;
  uVar11 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_100,comm);
  lVar39 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1a0 = in;
  if (lVar39 != 0) {
    lVar39 = lVar39 >> 3;
    ppVar16 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_001374dd:
    do {
      pppVar19 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar14) {
        uVar35 = (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar39 + -1];
        ppVar16 = ppVar14;
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
          if (uVar35 < local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first) {
            operator_delete(ppVar15);
            ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
            ppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            ppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            goto LAB_001374dd;
          }
        }
        else if (uVar35 < local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          goto LAB_001374dd;
        }
      }
      while( true ) {
        uVar35 = (long)local_208._M_impl.super__Deque_impl_data._M_finish._M_cur - (long)ppVar15 >>
                 4;
        puVar40 = (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (((long)local_208._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar16 >> 4) +
            uVar35 + ((((ulong)((long)pppVar19 -
                               (long)local_208._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) + (ulong)(pppVar19 == (_Map_pointer)0x0)) * 0x20 < 2) break;
        ppVar14 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
          ppVar14 = pppVar19[-1] + 0x20;
        }
        uVar31 = puVar40[lVar39 + -1];
        if (uVar31 != ppVar14[-1].first) break;
        uVar32 = uVar35 - 1;
        if ((long)uVar35 < 1) {
          uVar35 = (long)uVar32 >> 5;
LAB_001375e7:
          pppVar21 = pppVar19 + uVar35;
          ppVar24 = *pppVar21;
          ppVar12 = ppVar24 + uVar32 + uVar35 * -0x20;
        }
        else {
          if (0x20 < uVar35) {
            uVar35 = uVar32 >> 5;
            goto LAB_001375e7;
          }
          ppVar12 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar21 = pppVar19;
          ppVar24 = ppVar15;
        }
        if (ppVar12 == ppVar24) {
          ppVar12 = pppVar21[-1] + 0x20;
        }
        if (uVar31 != ppVar12[-1].first) break;
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
          operator_delete(ppVar15);
          pppVar19 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
          ppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar19;
        }
        else {
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar39 + (uVar11 - 1));
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar40[lVar39 + -1];
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_208,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar39 = lVar39 + -1;
      ppVar16 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
    } while (lVar39 != 0);
  }
  local_58.current._M_cur = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_208._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_208._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_168,&local_58,&local_78,(allocator_type *)&local_b0);
  pvVar4 = *(void **)local_170;
  *(pointer *)local_170 =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_170 + 8) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_170 + 0x10) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pvVar4 != (void *)0x0) &&
     (operator_delete(pvVar4),
     local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar22 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar21 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar15 = local_208._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_198 = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  local_1a8 = (pair<unsigned_long,_unsigned_long> *)
              (((long)local_208._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_208._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((long)local_208._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_208._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)local_208._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_208._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(local_208._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x20);
  pppVar19 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  pvVar23 = local_1a0;
  if (local_1a8 == (pair<unsigned_long,_unsigned_long> *)0x0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 0]"
                 );
  }
  for (; local_1a0 = pvVar23, pppVar19 < pppVar22; pppVar19 = pppVar19 + 1) {
    operator_delete(pppVar19[1]);
    pvVar23 = local_1a0;
  }
  local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar21;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_last = local_198;
  if ((pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar35 = 0;
    ppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
LAB_0013780f:
    do {
      pppVar19 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar16) {
        uVar32 = (pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar35];
        ppVar14 = ppVar16;
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
          if (uVar32 < local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first) {
            operator_delete(ppVar15);
            ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
            ppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            ppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            goto LAB_0013780f;
          }
        }
        else if (uVar32 < local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          goto LAB_0013780f;
        }
      }
      while( true ) {
        uVar32 = (long)local_208._M_impl.super__Deque_impl_data._M_finish._M_cur - (long)ppVar15 >>
                 4;
        puVar40 = (pointer)(pvVar23->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar35];
        if (((long)local_208._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar14 >> 4) +
            uVar32 + ((((ulong)((long)pppVar19 -
                               (long)local_208._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) + (ulong)(pppVar19 == (_Map_pointer)0x0)) * 0x20 < 2) break;
        ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
          ppVar18 = pppVar19[-1] + 0x20;
        }
        if (puVar40 != (pointer)ppVar18[-1].first) break;
        uVar29 = uVar32 - 1;
        if ((long)uVar32 < 1) {
          uVar32 = (long)uVar29 >> 5;
LAB_0013790d:
          pppVar21 = pppVar19 + uVar32;
          ppVar12 = *pppVar21;
          ppVar16 = ppVar12 + uVar29 + uVar32 * -0x20;
        }
        else {
          if (0x20 < uVar32) {
            uVar32 = uVar29 >> 5;
            goto LAB_0013790d;
          }
          ppVar16 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar21 = pppVar19;
          ppVar12 = ppVar15;
        }
        if (ppVar16 == ppVar12) {
          ppVar16 = pppVar21[-1] + 0x20;
        }
        if (puVar40 != (pointer)ppVar16[-1].first) break;
        if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
          operator_delete(ppVar15);
          pppVar19 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
          ppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar19;
        }
        else {
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar35 + uVar11);
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar40;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_208,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = (unsigned_long)puVar40;
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar35 = uVar35 + 1;
      ppVar14 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
    } while (uVar35 < (ulong)((long)(pvVar23->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar23->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar10 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar9 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar18 = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar35 = (long)local_208._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar41 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_198 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_208._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_208._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_208._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_150 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_208._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_208._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_98 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_170,*(undefined8 *)(local_170 + 8));
  pppVar22 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar21 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_118 = (local_208._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar39 = ((long)ppVar18 - (long)local_198 >> 4) + ((long)ppVar9 - (long)ppVar10 >> 4) +
           (((uVar35 >> 3) - 1) + (ulong)bVar41) * 0x20;
  ppVar15 = local_208._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_190 = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar19 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  pcVar8 = local_1b8;
  if (lVar39 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 0]"
                 );
  }
  for (; local_198 = ppVar15, local_1b8 = pcVar8, pppVar19 < pppVar22; pppVar19 = pppVar19 + 1) {
    operator_delete(pppVar19[1]);
    ppVar15 = local_198;
    pcVar8 = local_1b8;
  }
  local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar21;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_first = local_198;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_190;
  if (lVar39 + (long)local_1a8 !=
      (long)(*(size_type *)(local_170 + 8) - *(size_type *)local_170) >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_168,&local_118,1,pcVar8);
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)pcVar8->m_size,(value_type_conflict *)&local_c8,
             (allocator_type *)&local_f8);
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c8,(long)pcVar8->m_size,(value_type_conflict *)&local_f8,
             (allocator_type *)&local_e0);
  comm_00 = local_1b8;
  iVar2 = pcVar8->m_rank;
  lVar39 = (long)iVar2;
  if (0 < lVar39) {
    uVar35 = *(ulong *)((long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar39 * 8 + -8);
    local_198 = *(pair<unsigned_long,_unsigned_long> **)local_170;
    uVar31 = 0;
    lVar33 = lVar39;
    do {
      uVar27 = uVar31;
      if ((uVar31 != 0 && lVar33 < lVar39) &&
         (uVar27 = uVar31 - 1, uVar35 < local_198[uVar31 - 1].first)) {
        uVar27 = uVar31;
      }
      ppVar15 = (pair<unsigned_long,_unsigned_long> *)(uVar31 + 1);
      if (uVar31 + 1 < local_1a8) {
        ppVar15 = local_1a8;
      }
      lVar1 = lVar33 + -1;
      uVar32 = *(ulong *)((long)local_168.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar1 * 8);
      puVar34 = (ulong *)(uVar31 * 0x10 + *(size_type *)local_170);
      uVar30 = uVar31 - 1;
      do {
        uVar31 = (long)ppVar15 - 1;
        if (uVar30 + (1 - (long)ppVar15) == -1) break;
        uVar31 = uVar30 + 1;
        uVar29 = *puVar34;
        puVar34 = puVar34 + 2;
        uVar30 = uVar31;
      } while (uVar32 <= uVar29);
      if (uVar32 <= uVar35) {
        *(unsigned_long *)
         ((long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar1 * 8) = (uVar31 - uVar27) + 1;
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar1] = uVar27;
        uVar35 = uVar32;
        if (*(ulong *)((long)local_168.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar1 * 8) < local_118)
        break;
      }
      bVar41 = 1 < lVar33;
      lVar33 = lVar1;
    } while (bVar41);
  }
  iVar3 = local_1b8->m_size;
  if (iVar2 < iVar3 + -1) {
    sVar5 = *(size_type *)local_170;
    uVar29 = (long)(*(size_type *)(local_170 + 8) - sVar5) >> 4;
    uVar35 = ((unsigned_long *)
             ((long)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar39];
    local_198 = (pair<unsigned_long,_unsigned_long> *)
                local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar39 = lVar39 + 1;
    uVar32 = uVar29 - 1;
    iVar38 = iVar2;
    do {
      uVar37 = uVar32;
      if (iVar2 < iVar38) {
        uVar25 = uVar32 + 1;
        if (uVar32 + 1 < uVar29) {
          uVar25 = uVar29;
        }
        puVar34 = (ulong *)(uVar32 * 0x10 + sVar5 + 0x10);
        uVar36 = uVar32 - 1;
        do {
          uVar37 = uVar25 - 1;
          if (uVar29 <= uVar36 + 2) break;
          uVar37 = uVar36 + 1;
          uVar6 = *puVar34;
          puVar34 = puVar34 + 2;
          uVar36 = uVar37;
        } while (uVar6 <= uVar35);
      }
      uVar25 = local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar39];
      ppVar15 = (pair<unsigned_long,_unsigned_long> *)uVar32;
      if (local_1a8 < uVar32) {
        puVar34 = (ulong *)(uVar32 * 0x10 + sVar5);
        do {
          ppVar15 = (pair<unsigned_long,_unsigned_long> *)uVar32;
          if (*puVar34 < uVar25) break;
          uVar32 = uVar32 - 1;
          puVar34 = puVar34 + -2;
          ppVar15 = local_1a8;
        } while (local_1a8 < uVar32);
      }
      if (uVar25 <= uVar35) {
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar39] = (uVar37 - (long)ppVar15) + 1;
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar39] = (unsigned_long)ppVar15;
        uVar35 = uVar25;
        if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar39] < local_118) break;
      }
      iVar38 = (int)lVar39;
      lVar39 = lVar39 + 1;
      uVar32 = (ulong)ppVar15;
    } while (iVar3 != (int)lVar39);
  }
  mxx::all2all<unsigned_long>(&local_f8,&local_b0,local_1b8);
  mxx::impl::get_displacements<unsigned_long>(&local_e0,&local_f8);
  uVar31 = local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar27 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_138,(size_type)(uVar31 + uVar27),(allocator_type *)&local_148);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_170,&local_b0,&local_c8,
             local_138.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f8,&local_e0,comm_00);
  local_1a8 = (pair<unsigned_long,_unsigned_long> *)
              local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_00->m_rank];
  local_120 = (pair<unsigned_long,_unsigned_long> *)(uVar31 + uVar27);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,local_100);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_1b0,local_100);
  pppVar22 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar21 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_198 = local_208._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_190 = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  pvVar23 = local_1a0;
  for (pppVar19 = local_208._M_impl.super__Deque_impl_data._M_start._M_node; local_1a0 = pvVar23,
      pppVar19 < pppVar22; pppVar19 = pppVar19 + 1) {
    operator_delete(pppVar19[1]);
    pvVar23 = local_1a0;
  }
  local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar21;
  lVar39 = (long)(pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_first = local_198;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_190;
  if (lVar39 != 0) {
    lVar39 = lVar39 >> 3;
    local_198 = (pair<unsigned_long,_unsigned_long> *)(uVar11 - 1);
    do {
      uVar31 = (long)&local_198->first + lVar39;
      lVar39 = lVar39 + -1;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_208._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar40 = (pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          uVar35 = puVar40[lVar39];
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
            ppVar16 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar16[0x1f].first <= uVar35) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar16[0x1f].second - uVar11] = uVar31;
            ppVar14 = ppVar16 + 0x20;
          }
          else {
            if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar35)
            break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] = uVar31
            ;
            ppVar14 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar27 = ppVar14[-1].first;
          uVar30 = ppVar14[-1].second;
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar15)
          goto LAB_00137fc9;
          while( true ) {
            operator_delete(ppVar15);
            ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            while( true ) {
              if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_208._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00138008;
              if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) break;
              if (uVar27 != local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              goto LAB_00137fff;
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
              _M_impl).super__Vector_impl_data._M_start
              [local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] =
                   uVar30;
LAB_00137fc9:
              local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (uVar27 != local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar11] =
                 uVar30;
          }
LAB_00137fff:
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_208._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        } while( true );
      }
LAB_00138008:
      pvVar23 = local_1a0;
      local_148.first =
           (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar39];
      local_148.second = uVar31;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_208,&local_148);
      }
      else {
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_148.first;
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar31;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar39 != 0);
  }
  ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_1a8 != (pair<unsigned_long,_unsigned_long> *)0x0) {
    local_90 = (pair<unsigned_long,_unsigned_long> *)((long)&local_1a8[-1].second + 7);
    local_88 = (long)local_1a8 * 0x10 + -0x10;
    ppVar24 = (pair<unsigned_long,_unsigned_long> *)0x0;
    ppVar12 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
LAB_0013809a:
    if (ppVar12 != ppVar16) {
      lVar39 = (long)&local_1a8->first + ~(ulong)ppVar24;
      local_80 = lVar39 * 0x10;
      local_1b8 = (comm *)local_138.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar39].second;
      local_198 = local_138.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar39;
      ppVar20 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_110 = ppVar24;
LAB_001380e7:
      if (ppVar12 == ppVar20) {
        ppVar24 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (ppVar24[0x1f].first <= local_198->first) goto LAB_0013825e;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar24[0x1f].second - uVar11] = (unsigned_long)local_1b8
        ;
        uVar31 = ppVar24[0x1f].first;
        uVar27 = ppVar24[0x1f].second;
        operator_delete(ppVar20);
        ppVar20 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar20 + 0x20;
        ppVar12 = ppVar20 + 0x1f;
        ppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar20;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        if (ppVar12[-1].first <= local_198->first) goto LAB_0013825e;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar12[-1].second - uVar11] = (unsigned_long)local_1b8;
        uVar31 = ppVar12[-1].first;
        uVar27 = ppVar12[-1].second;
        ppVar12 = ppVar12 + -1;
      }
      ppVar15 = ppVar12;
      local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
      if (ppVar12 != ppVar16) {
        do {
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
          if (ppVar12 == ppVar20) {
            if (uVar31 != local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) goto LAB_0013824d;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar11] =
                 uVar27;
            operator_delete(ppVar20);
            ppVar20 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar20 + 0x20;
            ppVar12 = ppVar20 + 0x1f;
            ppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar20;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (uVar31 != ppVar12[-1].first) goto LAB_0013824d;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar12[-1].second - uVar11] = uVar27;
            ppVar12 = ppVar12 + -1;
          }
          ppVar15 = ppVar12;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
          if (ppVar12 == ppVar16) break;
        } while( true );
      }
      goto LAB_0013825e;
    }
  }
LAB_001383d0:
  pppVar19 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  local_1b8 = (comm *)local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (ppVar15 != ppVar16) {
    local_198 = (pair<unsigned_long,_unsigned_long> *)
                (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)
                ->_M_impl).super__Vector_impl_data._M_start;
    pppVar21 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar14 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_0013840e:
    puVar40 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
              _M_impl).super__Vector_impl_data._M_start;
    pppVar22 = pppVar21;
    ppVar12 = ppVar15;
    ppVar24 = ppVar14;
    do {
      uVar29 = (long)ppVar12 - (long)ppVar24 >> 4;
      uVar35 = uVar29 - 1;
      uVar37 = (long)uVar35 >> 5;
      uVar32 = uVar37;
      if ((long)uVar29 < 1) {
LAB_00138448:
        ppVar20 = pppVar22[uVar32] + uVar35 + uVar32 * -0x20;
      }
      else {
        if (0x20 < uVar29) {
          uVar32 = uVar35 >> 5;
          goto LAB_00138448;
        }
        ppVar20 = ppVar12 + -1;
      }
      if (ppVar20 == ppVar16) goto LAB_00138512;
      ppVar20 = ppVar15;
      if (ppVar15 == ppVar14) {
        ppVar20 = pppVar21[-1] + 0x20;
      }
      if ((long)uVar29 < 1) {
LAB_0013849c:
        pppVar26 = pppVar22 + uVar37;
        ppVar28 = *pppVar26;
        ppVar13 = ppVar28 + uVar35 + uVar37 * -0x20;
      }
      else {
        if (0x20 < uVar29) {
          uVar37 = uVar35 >> 5;
          goto LAB_0013849c;
        }
        ppVar13 = ppVar12 + -1;
        pppVar26 = pppVar22;
        ppVar28 = ppVar24;
      }
      if (ppVar13 == ppVar28) {
        ppVar13 = pppVar26[-1] + 0x20;
      }
      if (ppVar20[-1].first != ppVar13[-1].first) goto LAB_00138512;
      if (ppVar12 == ppVar24) {
        ppVar24 = pppVar22[-1];
        pppVar22 = pppVar22 + -1;
        ppVar12 = ppVar24 + 0x20;
      }
      ppVar20 = ppVar15;
      if (ppVar15 == ppVar14) {
        ppVar20 = pppVar21[-1] + 0x20;
      }
      ppVar12 = ppVar12 + -1;
      ppVar13 = ppVar12;
      if (ppVar12 == ppVar24) {
        ppVar13 = pppVar22[-1] + 0x20;
      }
      puVar40[ppVar13[-1].second - uVar11] = ppVar20[-1].second;
    } while( true );
  }
LAB_00138563:
  local_188 = local_208._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_180 = local_208._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar21 = local_208._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_208._M_impl.super__Deque_impl_data._M_start._M_node <
      local_208._M_impl.super__Deque_impl_data._M_finish._M_node) {
    do {
      pppVar22 = pppVar21 + 1;
      operator_delete(pppVar21[1]);
      pppVar21 = pppVar22;
    } while (pppVar22 < local_1b8);
  }
  local_208._M_impl.super__Deque_impl_data._M_finish._M_first = local_188;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_180;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar19;
  puVar40 = (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar16;
  if ((local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar40) {
    uVar35 = 0;
    do {
      uVar31 = uVar35 + uVar11;
      ppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_208._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) {
            ppVar16 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar16[0x1f].first <= puVar40[uVar35]) break;
            (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar16[0x1f].second - uVar11] = uVar31;
            ppVar18 = ppVar16 + 0x20;
          }
          else {
            if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <=
                puVar40[uVar35]) break;
            (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] = uVar31
            ;
            ppVar18 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar27 = ppVar18[-1].first;
          uVar30 = ppVar18[-1].second;
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar15)
          goto LAB_001386a6;
          while( true ) {
            operator_delete(ppVar15);
            ppVar15 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15 + 0x20;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15 + 0x1f;
            ppVar14 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar15;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            while( true ) {
              if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14)
              goto LAB_001386e2;
              if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) break;
              if (uVar27 != local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              goto LAB_001386d9;
              (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start
              [local_208._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar11] =
                   uVar30;
LAB_001386a6:
              local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (uVar27 != local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) break;
            (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar11] =
                 uVar30;
          }
LAB_001386d9:
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar14) break;
        } while( true );
      }
LAB_001386e2:
      local_148.first =
           (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar35];
      local_148.second = uVar31;
      if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_208,&local_148);
      }
      else {
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_148.first;
        (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar31;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar35 = uVar35 + 1;
      puVar40 = (local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar35 < (ulong)((long)(local_1a0->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar40 >> 3
                             ));
  }
  ppVar15 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar16 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_120 != local_1a8) {
    local_1b8 = (comm *)((long)local_120 - (long)local_1a8);
    local_120 = (pair<unsigned_long,_unsigned_long> *)((long)&local_120[-1].second + 7);
    pppVar19 = (_Map_pointer)0x0;
    ppVar12 = local_208._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar24 = local_1a8;
LAB_0013878c:
    if (ppVar12 != ppVar15) {
      local_198 = (pair<unsigned_long,_unsigned_long> *)((long)pppVar19 + (long)ppVar24);
      local_1a0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)local_198 * 0x10);
      local_188 = (pair<unsigned_long,_unsigned_long> *)
                  local_138.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)local_198].second;
      ppVar20 = local_138.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)local_198;
      ppVar24 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_001387c7:
      if (ppVar12 == ppVar24) {
        ppVar13 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (ppVar13[0x1f].first <= ppVar20->first) goto LAB_00138930;
        (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar13[0x1f].second - uVar11] = (unsigned_long)local_188;
        uVar31 = ppVar13[0x1f].first;
        uVar27 = ppVar13[0x1f].second;
        operator_delete(ppVar24);
        ppVar24 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar24 + 0x20;
        ppVar12 = ppVar24 + 0x1f;
        ppVar15 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar24;
        local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        if (ppVar12[-1].first <= ppVar20->first) goto LAB_00138930;
        (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar12[-1].second - uVar11] = (unsigned_long)local_188;
        uVar31 = ppVar12[-1].first;
        uVar27 = ppVar12[-1].second;
        ppVar12 = ppVar12 + -1;
      }
      ppVar16 = ppVar12;
      local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
      if (ppVar12 != ppVar15) {
        do {
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
          if (ppVar12 == ppVar24) {
            if (uVar31 != local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) goto LAB_0013891f;
            (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar11] =
                 uVar27;
            operator_delete(ppVar24);
            ppVar24 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_208._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar24 + 0x20;
            ppVar12 = ppVar24 + 0x1f;
            ppVar15 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar24;
            local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (uVar31 != ppVar12[-1].first) goto LAB_0013891f;
            (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar12[-1].second - uVar11] = uVar27;
            ppVar12 = ppVar12 + -1;
          }
          ppVar16 = ppVar12;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
          if (ppVar12 == ppVar15) break;
        } while( true );
      }
      goto LAB_00138930;
    }
  }
LAB_00138ad5:
  if (ppVar16 == ppVar15) {
LAB_00138c58:
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)local_170,&local_138);
    if (local_138.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
      operator_delete(local_138.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pair<unsigned_long,_unsigned_long> *)
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
      operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pair<unsigned_long,_unsigned_long> *)
        local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
      operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base(&local_208);
    return;
  }
  local_188 = (pair<unsigned_long,_unsigned_long> *)
              (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
  pppVar19 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppVar14 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00138b06:
  puVar40 = (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pppVar21 = pppVar19;
  ppVar24 = ppVar14;
  ppVar12 = ppVar16;
  do {
    uVar37 = (long)ppVar12 - (long)ppVar24 >> 4;
    uVar35 = uVar37 - 1;
    uVar29 = (long)uVar35 >> 5;
    uVar32 = uVar29;
    if ((long)uVar37 < 1) {
LAB_00138b3d:
      ppVar20 = pppVar21[uVar32] + uVar35 + uVar32 * -0x20;
    }
    else {
      if (0x20 < uVar37) {
        uVar32 = uVar35 >> 5;
        goto LAB_00138b3d;
      }
      ppVar20 = ppVar12 + -1;
    }
    if (ppVar20 == ppVar15) goto LAB_00138c07;
    ppVar20 = ppVar16;
    if (ppVar16 == ppVar14) {
      ppVar20 = pppVar19[-1] + 0x20;
    }
    if ((long)uVar37 < 1) {
LAB_00138b91:
      pppVar22 = pppVar21 + uVar29;
      ppVar28 = *pppVar22;
      ppVar13 = ppVar28 + uVar35 + uVar29 * -0x20;
    }
    else {
      if (0x20 < uVar37) {
        uVar29 = uVar35 >> 5;
        goto LAB_00138b91;
      }
      ppVar13 = ppVar12 + -1;
      ppVar28 = ppVar24;
      pppVar22 = pppVar21;
    }
    if (ppVar13 == ppVar28) {
      ppVar13 = pppVar22[-1] + 0x20;
    }
    if (ppVar20[-1].first != ppVar13[-1].first) goto LAB_00138c07;
    if (ppVar12 == ppVar24) {
      ppVar24 = pppVar21[-1];
      pppVar21 = pppVar21 + -1;
      ppVar12 = ppVar24 + 0x20;
    }
    ppVar20 = ppVar16;
    if (ppVar16 == ppVar14) {
      ppVar20 = pppVar19[-1] + 0x20;
    }
    ppVar12 = ppVar12 + -1;
    ppVar13 = ppVar12;
    if (ppVar12 == ppVar24) {
      ppVar13 = pppVar21[-1] + 0x20;
    }
    puVar40[ppVar13[-1].second - uVar11] = ppVar20[-1].second;
  } while( true );
LAB_0013824d:
  ppVar15 = ppVar12;
  if (ppVar12 == ppVar16) goto LAB_0013825e;
  goto LAB_001380e7;
LAB_0013825e:
  ppVar24 = local_110;
  if (ppVar12 != ppVar16) {
    ppVar20 = ppVar12;
    if (ppVar12 == local_208._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar20 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (*(unsigned_long *)
         ((long)&(local_138.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first + local_80) == ppVar20[-1].first
       ) {
      ppVar12 = ppVar15;
      if (lVar39 != 0) {
        plVar17 = (long *)((long)&local_138.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-(long)local_110].first
                          + local_88);
        ppVar15 = local_110;
        do {
          ppVar24 = ppVar15;
          if (*plVar17 != plVar17[-2]) goto LAB_001382df;
          ppVar15 = (pair<unsigned_long,_unsigned_long> *)((long)&ppVar15->first + 1);
          plVar17 = plVar17 + -2;
          lVar39 = lVar39 + -1;
          ppVar24 = local_90;
        } while (lVar39 != 0);
      }
      lVar39 = 0;
LAB_001382df:
      ppVar15 = ppVar12;
      if (ppVar12 != ppVar16) {
        if (ppVar12 == local_208._M_impl.super__Deque_impl_data._M_finish._M_first) {
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first !=
              local_138.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar39].first) goto LAB_001383c2;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
          _M_impl).super__Vector_impl_data._M_start
          [local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar11] =
               local_138.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar39].second;
          operator_delete(local_208._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_208._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar12 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar16 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar12[-1].first !=
              local_138.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar39].first) goto LAB_001383c2;
          ppVar15 = ppVar12 + -1;
          ppVar12 = ppVar12 + -1;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar15->second - uVar11] =
               local_138.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar39].second;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
        }
        goto LAB_001382df;
      }
    }
  }
LAB_001383c2:
  ppVar24 = (pair<unsigned_long,_unsigned_long> *)((long)&ppVar24->first + 1);
  if (local_1a8 <= ppVar24) goto LAB_001383d0;
  goto LAB_0013809a;
LAB_00138512:
  if (ppVar15 == ppVar14) {
    ppVar15 = pppVar21[-1] + 0x20;
  }
  *(size_t *)((long)local_198 + (ppVar15[-1].second - uVar11) * 8) = local_108;
  if (ppVar12 == ppVar24) {
    ppVar24 = pppVar22[-1];
    pppVar22 = pppVar22 + -1;
    ppVar12 = ppVar24 + 0x20;
  }
  ppVar15 = ppVar12 + -1;
  pppVar21 = pppVar22;
  ppVar14 = ppVar24;
  if (ppVar15 == ppVar16) goto LAB_00138563;
  goto LAB_0013840e;
LAB_0013891f:
  ppVar16 = ppVar12;
  if (ppVar12 == ppVar15) goto LAB_00138930;
  goto LAB_001387c7;
LAB_00138930:
  ppVar24 = local_1a8;
  pcVar8 = local_1b8;
  if (ppVar12 != ppVar15) {
    ppVar20 = ppVar12;
    if (ppVar12 == local_208._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar20 = local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (*(unsigned_long *)
         ((long)&(local_1a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start +
         (long)&(local_138.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar20[-1].first) {
      ppVar20 = local_198;
      ppVar12 = ppVar16;
      if (((_Map_pointer)((long)pppVar19 + 1U) < local_1b8) &&
         (*(long *)((long)&(local_1a0->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start +
                   (long)&(local_138.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first) ==
          *(long *)((long)&(local_1a0->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start +
                   (long)&local_138.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].first))) {
        ppVar16 = local_138.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)pppVar19 + (long)local_1a8 + 2;
        do {
          pppVar21 = pppVar19;
          ppVar20 = local_120;
          if (local_1b8 <= (_Map_pointer)((long)pppVar21 + 2U)) goto LAB_001389f0;
          ppVar20 = ppVar16 + -1;
          puVar7 = &ppVar16->first;
          ppVar16 = ppVar16 + 1;
          pppVar19 = (_Map_pointer)((long)pppVar21 + 1);
        } while (ppVar20->first == *puVar7);
        ppVar20 = (pair<unsigned_long,_unsigned_long> *)((long)pppVar21 + 1 + (long)local_1a8);
LAB_001389f0:
        pppVar19 = (_Map_pointer)((long)pppVar21 + 1);
      }
      while (ppVar16 = ppVar12, ppVar12 != ppVar15) {
        if (ppVar12 == local_208._M_impl.super__Deque_impl_data._M_finish._M_first) {
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first !=
              local_138.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)ppVar20].first) break;
          (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar11] =
               local_138.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)ppVar20].second;
          operator_delete(local_208._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_208._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_208._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar12 = local_208._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar15 = local_208._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_208._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar12[-1].first !=
              local_138.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)ppVar20].first) break;
          ppVar16 = ppVar12 + -1;
          ppVar12 = ppVar12 + -1;
          (local_1b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar16->second - uVar11] =
               local_138.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)ppVar20].second;
          local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12;
        }
      }
    }
  }
  pppVar19 = (_Map_pointer)((long)pppVar19 + 1);
  if (pcVar8 <= pppVar19) goto LAB_00138ad5;
  goto LAB_0013878c;
LAB_00138c07:
  if (ppVar16 == ppVar14) {
    ppVar16 = pppVar19[-1] + 0x20;
  }
  *(size_t *)((long)local_188 + (ppVar16[-1].second - uVar11) * 8) = local_108;
  if (ppVar12 == ppVar24) {
    ppVar24 = pppVar21[-1];
    pppVar21 = pppVar21 + -1;
    ppVar12 = ppVar24 + 0x20;
  }
  ppVar16 = ppVar12 + -1;
  pppVar19 = pppVar21;
  ppVar14 = ppVar24;
  if (ppVar16 == ppVar15) goto LAB_00138c58;
  goto LAB_00138b06;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}